

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall IRBuilderAsmJs::BuildEmpty(IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset)

{
  code *pcVar1;
  IRType IVar2;
  bool bVar3;
  Which WVar4;
  AsmJsType asmType;
  RegSlot RVar5;
  JitArenaAllocator *in_RAX;
  Instr *pIVar6;
  RegOpnd *pRVar7;
  IndirOpnd *newSrc;
  undefined4 *puVar8;
  undefined6 in_register_00000032;
  IRBuilderAsmJs *this_00;
  int iVar9;
  undefined1 local_38 [4];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  IRType local_31 [5];
  ValueType vType;
  IRType irType;
  
  _local_38 = in_RAX;
  Js::ByteCodeReader::Empty(&this->m_jnReader);
  iVar9 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar9 == 7) {
    return;
  }
  if (iVar9 != 8) {
    if (iVar9 == 0x10b) {
      pIVar6 = IR::Instr::New(ThrowRuntimeError,this->m_func);
      newSrc = (IndirOpnd *)IR::IntConstOpnd::New(0x1b59,TyInt32,pIVar6->m_func,false);
    }
    else {
      if (iVar9 != 0x13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x4a2,"((0))","(0)");
        if (bVar3) {
          *puVar8 = 0;
          return;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      pIVar6 = IR::Instr::New(ArrayDetachedCheck,this->m_func);
      pRVar7 = BuildSrcOpnd(this,2,TyVar);
      newSrc = IR::IndirOpnd::New(pRVar7,0x20,TyInt8,this->m_func,false);
    }
    IR::Instr::SetSrc1(pIVar6,&newSrc->super_Opnd);
    AddInstr(this,pIVar6,offset);
    return;
  }
  pIVar6 = IR::Instr::New(Ret,this->m_func);
  WVar4 = AsmJsJITInfo::GetRetType(this->m_asmFuncInfo);
  switch(WVar4) {
  case Int64:
    RVar5 = GetRegSlotFromInt64Reg(this,0);
    IVar2 = TyInt64;
    break;
  case Double:
    RVar5 = GetRegSlotFromDoubleReg(this,0);
    IVar2 = TyFloat64;
    goto LAB_004b6352;
  case Float:
    RVar5 = GetRegSlotFromFloatReg(this,0);
    IVar2 = TyFloat32;
LAB_004b6352:
    pRVar7 = BuildDstOpnd(this,RVar5,IVar2);
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    goto LAB_004b636d;
  case 4:
  case 5:
  case 6:
  case Floatish:
  case 8:
  case Fixnum:
    goto switchD_004b61ef_caseD_4;
  case Signed:
    RVar5 = GetRegSlotFromIntReg(this,0);
    IVar2 = TyInt32;
    break;
  default:
    if (WVar4 == Void) goto LAB_004b637d;
    goto switchD_004b61ef_caseD_4;
  }
  pRVar7 = BuildDstOpnd(this,RVar5,IVar2);
  local_34.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetInt(false);
LAB_004b636d:
  IR::Opnd::SetValueType(&pRVar7->super_Opnd,(ValueType)local_34.field_0);
  IR::Instr::SetSrc1(pIVar6,&pRVar7->super_Opnd);
LAB_004b637d:
  AddInstr(this,pIVar6,offset);
  return;
switchD_004b61ef_caseD_4:
  ValueType::ValueType((ValueType *)(local_38 + 4));
  WVar4 = AsmJsJITInfo::GetRetType(this->m_asmFuncInfo);
  this_00 = (IRBuilderAsmJs *)local_38;
  Js::AsmJsRetType::AsmJsRetType((AsmJsRetType *)this_00,WVar4);
  asmType = Js::AsmJsRetType::toType((AsmJsRetType *)this_00);
  GetSimdTypesFromAsmType(this_00,asmType.which_,local_38 + 7,(ValueType *)(local_38 + 4));
  RVar5 = GetRegSlotFromSimd128Reg(this,0);
  pRVar7 = BuildDstOpnd(this,RVar5,local_31[0]);
  goto LAB_004b636d;
}

Assistant:

void
IRBuilderAsmJs::BuildEmpty(Js::OpCodeAsmJs newOpcode, uint32 offset)
{
    m_jnReader.Empty();

    IR::Instr * instr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    Js::RegSlot retSlot;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::CheckHeap:
        instr = IR::Instr::New(Js::OpCode::ArrayDetachedCheck, m_func);
        instr->SetSrc1(IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::ArrayReg, TyVar), Js::ArrayBuffer::GetIsDetachedOffset(), TyInt8, m_func));
        AddInstr(instr, offset);
        break;
    case Js::OpCodeAsmJs::Unreachable_Void:
        instr = IR::Instr::New(Js::OpCode::ThrowRuntimeError, m_func);
        instr->SetSrc1(IR::IntConstOpnd::New(SCODE_CODE(WASMERR_Unreachable), TyInt32, instr->m_func));
        AddInstr(instr, offset);
        break;
    case Js::OpCodeAsmJs::Ret:
        instr = IR::Instr::New(Js::OpCode::Ret, m_func);

        switch (m_asmFuncInfo->GetRetType())
        {
        case Js::AsmJsRetType::Which::Signed:
            retSlot = GetRegSlotFromIntReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyInt32);
            regOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Float:
            retSlot = GetRegSlotFromFloatReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyFloat32);
            regOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Double:
            retSlot = GetRegSlotFromDoubleReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyFloat64);
            regOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsVarType::Which::Int64:
            retSlot = GetRegSlotFromInt64Reg(0);
            regOpnd = BuildDstOpnd(retSlot, TyInt64);
            regOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Void:
            break;

        default:
        {
            IRType irType;
            ValueType vType;
            GetSimdTypesFromAsmType(Js::AsmJsRetType(m_asmFuncInfo->GetRetType()).toType().GetWhich(), &irType, &vType);
            retSlot = GetRegSlotFromSimd128Reg(0);
            regOpnd = BuildDstOpnd(retSlot, irType);
            regOpnd->SetValueType(vType);
        }

        }
        if (regOpnd)
        {
            instr->SetSrc1(regOpnd);
        }
        AddInstr(instr, offset);
        break;

    case Js::OpCodeAsmJs::Label:
        // NOP
        break;

    default:
        Assume(UNREACHED);
    }
}